

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  FileDescriptor *file;
  long lVar6;
  allocator<char> local_131;
  FileGenerator *local_130;
  long local_128;
  string *local_120;
  Descriptor *local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  string *local_108;
  long local_100;
  EnumDescriptor *local_f8;
  string filename;
  string filename_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Printer printer;
  ZeroCopyOutputStream *pZVar4;
  
  file = this->file_;
  if (*(char *)(*(long *)(file + 0x88) + 0x54) == '\x01') {
    local_120 = &this->java_package_;
    lVar6 = 0;
    lVar5 = 0;
    local_130 = this;
    local_118 = (Descriptor *)context;
    local_110 = file_list;
    local_108 = package_dir;
    while (lVar5 < *(int *)(file + 0x58)) {
      lVar1 = *(long *)(file + 0x60);
      local_100 = lVar5;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_131);
      local_f8 = (EnumDescriptor *)(lVar1 + lVar6);
      local_128 = lVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &filename_1,local_108,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_f8
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &filename_1,&local_98);
      std::operator+(&filename,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     ".java");
      std::__cxx11::string::~string((string *)&printer);
      std::__cxx11::string::~string((string *)&filename_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_110,&filename);
      iVar3 = (*(*(_func_int ***)local_118)[2])(local_118,&filename);
      pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
      io::Printer::Printer(&printer,pZVar4,'$');
      io::Printer::Print(&printer,
                         "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                         ,"filename",(string *)**(undefined8 **)(lVar1 + 0x10 + local_128));
      if ((local_130->java_package_)._M_string_length != 0) {
        io::Printer::Print(&printer,"package $package$;\n\n","package",local_120);
      }
      EnumGenerator::EnumGenerator((EnumGenerator *)&filename_1,local_f8);
      EnumGenerator::Generate((EnumGenerator *)&filename_1,&printer);
      EnumGenerator::~EnumGenerator((EnumGenerator *)&filename_1);
      io::Printer::~Printer(&printer);
      if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
      }
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&local_98);
      file = local_130->file_;
      lVar6 = local_128 + 0x38;
      lVar5 = local_100 + 1;
    }
    lVar6 = 0;
    for (lVar5 = 0; lVar5 < *(int *)(file + 0x48); lVar5 = lVar5 + 1) {
      lVar1 = *(long *)(file + 0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&printer,"OrBuilder",(allocator<char> *)&filename);
      filename_1._M_dataplus._M_p = (pointer)MessageGenerator::GenerateInterface;
      filename_1._M_string_length = 0;
      GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                ((java *)local_108,local_120,(string *)(lVar1 + lVar6),local_118,
                 (GeneratorContext *)local_110,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&printer,(string *)MessageGenerator::GenerateInterface,0);
      std::__cxx11::string::~string((string *)&printer);
      lVar1 = *(long *)(local_130->file_ + 0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&printer,"",(allocator<char> *)&filename);
      filename_1._M_dataplus._M_p = (pointer)MessageGenerator::Generate;
      filename_1._M_string_length = 0;
      GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                ((java *)local_108,local_120,(string *)(lVar1 + lVar6),local_118,
                 (GeneratorContext *)local_110,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&printer,(string *)MessageGenerator::Generate,0);
      std::__cxx11::string::~string((string *)&printer);
      file = local_130->file_;
      lVar6 = lVar6 + 0x78;
    }
    bVar2 = HasGenericServices(file);
    if (bVar2) {
      lVar5 = 0;
      local_100 = 0;
      while( true ) {
        if (*(int *)(local_130->file_ + 0x68) <= local_100) break;
        lVar6 = *(long *)(local_130->file_ + 0x70);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_131);
        local_f8 = (EnumDescriptor *)(lVar6 + lVar5);
        local_128 = lVar5;
        std::operator+(&filename,local_108,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        local_f8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,&filename,&local_98);
        std::operator+(&filename_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,".java");
        std::__cxx11::string::~string((string *)&printer);
        std::__cxx11::string::~string((string *)&filename);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_110,&filename_1);
        iVar3 = (*(*(_func_int ***)local_118)[2])(local_118,&filename_1);
        pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
        io::Printer::Printer(&printer,pZVar4,'$');
        io::Printer::Print(&printer,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar6 + 0x10 + local_128));
        if ((local_130->java_package_)._M_string_length != 0) {
          io::Printer::Print(&printer,"package $package$;\n\n","package",local_120);
        }
        ServiceGenerator::ServiceGenerator
                  ((ServiceGenerator *)&filename,(ServiceDescriptor *)local_f8);
        ServiceGenerator::Generate((ServiceGenerator *)&filename,&printer);
        ServiceGenerator::~ServiceGenerator((ServiceGenerator *)&filename);
        io::Printer::~Printer(&printer);
        if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
        }
        std::__cxx11::string::~string((string *)&filename_1);
        std::__cxx11::string::~string((string *)&local_98);
        local_100 = local_100 + 1;
        lVar5 = local_128 + 0x30;
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     vector<string>* file_list) {
  if (file_->options().java_multiple_files()) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      GenerateSibling<EnumGenerator>(package_dir, java_package_,
                                     file_->enum_type(i),
                                     context, file_list, "",
                                     &EnumGenerator::Generate);
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "OrBuilder",
                                        &MessageGenerator::GenerateInterface);
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "",
                                        &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        GenerateSibling<ServiceGenerator>(package_dir, java_package_,
                                          file_->service(i),
                                          context, file_list, "",
                                          &ServiceGenerator::Generate);
      }
    }
  }
}